

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O2

int CfdGetPsbtPubkeyRecord
              (void *handle,void *psbt_handle,int kind,uint32_t index,char *pubkey,char **value)

{
  char *pcVar1;
  CfdException *pCVar2;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_258;
  int kind_local;
  ByteData data;
  ByteData key;
  ExtPubkey local_208;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_198;
  KeyData pk_obj;
  
  kind_local = kind;
  cfd::Initialize();
  std::__cxx11::string::string((string *)&pk_obj,"PsbtHandle",(allocator *)&local_208);
  cfd::capi::CheckBuffer(psbt_handle,(string *)&pk_obj);
  std::__cxx11::string::~string((string *)&pk_obj);
  if (pubkey == (char *)0x0) {
    pk_obj.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "cfdcapi_psbt.cpp";
    pk_obj.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x5fc;
    pk_obj.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = "CfdGetPsbtPubkeyRecord";
    cfd::core::logger::warn<>((CfdSourceLocation *)&pk_obj,"pubkey is null.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&pk_obj,"Failed to parameter. pubkey is null.",(allocator *)&local_208);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&pk_obj);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (value != (char **)0x0) {
    if (*(long *)((long)psbt_handle + 0x18) != 0) {
      cfd::capi::ParsePubkey(&pk_obj,kind,pubkey,*(NetType *)((long)psbt_handle + 0x10));
      cfd::core::ByteData::ByteData(&key);
      cfd::core::ByteData::ByteData(&data);
      switch(kind) {
      case 1:
        cfd::core::KeyData::GetPubkey((Pubkey *)&_Stack_258,&pk_obj);
        cfd::core::Psbt::CreatePubkeyRecordKey
                  (&local_208.serialize_data_,'\x02',(Pubkey *)&_Stack_258);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&key,&local_208);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_208);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_258)
        ;
        cfd::core::Psbt::GetTxInRecord
                  (&local_208.serialize_data_,*(Psbt **)((long)psbt_handle + 0x18),index,&key);
        break;
      case 2:
        cfd::core::KeyData::GetPubkey((Pubkey *)&_Stack_258,&pk_obj);
        cfd::core::Psbt::CreatePubkeyRecordKey
                  (&local_208.serialize_data_,'\x06',(Pubkey *)&_Stack_258);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&key,&local_208);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_208);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_258)
        ;
        cfd::core::Psbt::GetTxInRecord
                  (&local_208.serialize_data_,*(Psbt **)((long)psbt_handle + 0x18),index,&key);
        break;
      case 3:
        cfd::core::KeyData::GetPubkey((Pubkey *)&_Stack_258,&pk_obj);
        cfd::core::Psbt::CreatePubkeyRecordKey
                  (&local_208.serialize_data_,'\x02',(Pubkey *)&_Stack_258);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&key,&local_208);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_208);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_258)
        ;
        cfd::core::Psbt::GetTxOutRecord
                  (&local_208.serialize_data_,*(Psbt **)((long)psbt_handle + 0x18),index,&key);
        break;
      case 4:
        cfd::core::KeyData::GetExtPubkey(&local_208,&pk_obj);
        cfd::core::ExtPubkey::GetData((ByteData *)&local_198,&local_208);
        cfd::core::Psbt::CreateFixRecordKey((ByteData *)&_Stack_258,'\x01',(ByteData *)&local_198);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&key,&_Stack_258);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_258)
        ;
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_198);
        cfd::core::ExtPubkey::~ExtPubkey(&local_208);
        cfd::core::Psbt::GetGlobalRecord
                  (&local_208.serialize_data_,*(Psbt **)((long)psbt_handle + 0x18),&key);
        break;
      default:
        local_208.serialize_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = "cfdcapi_psbt.cpp";
        local_208.serialize_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = 0x627;
        local_208.serialize_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = "CfdGetPsbtPubkeyRecord";
        cfd::core::logger::warn<int&>
                  ((CfdSourceLocation *)&local_208,"kind is invalid: {}",&kind_local);
        pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&local_208,"Failed to parameter. kind is invalid.",
                   (allocator *)&_Stack_258);
        cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&local_208);
        __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException
                   );
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data,&local_208);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_208);
      cfd::core::ByteData::GetHex_abi_cxx11_((string *)&local_208,&data);
      pcVar1 = cfd::capi::CreateString((string *)&local_208);
      *value = pcVar1;
      std::__cxx11::string::~string((string *)&local_208);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
      cfd::core::KeyData::~KeyData(&pk_obj);
      return 0;
    }
    pk_obj.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "cfdcapi_psbt.cpp";
    pk_obj.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x608;
    pk_obj.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = "CfdGetPsbtPubkeyRecord";
    cfd::core::logger::warn<>((CfdSourceLocation *)&pk_obj,"psbt is null.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&pk_obj,"Failed to handle statement. psbt is null.",(allocator *)&local_208
              );
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)&pk_obj);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  pk_obj.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = "cfdcapi_psbt.cpp";
  pk_obj.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x602;
  pk_obj.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = "CfdGetPsbtPubkeyRecord";
  cfd::core::logger::warn<>((CfdSourceLocation *)&pk_obj,"value is null.");
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&pk_obj,"Failed to parameter. value is null.",(allocator *)&local_208);
  cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&pk_obj);
  __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetPsbtPubkeyRecord(
    void* handle, void* psbt_handle, int kind, uint32_t index,
    const char* pubkey, char** value) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (pubkey == nullptr) {
      warn(CFD_LOG_SOURCE, "pubkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null.");
    }
    if (value == nullptr) {
      warn(CFD_LOG_SOURCE, "value is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. value is null.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    KeyData pk_obj = ParsePubkey(kind, pubkey, psbt_obj->net_type);
    ByteData key;
    ByteData data;
    switch (kind) {
      case kCfdPsbtRecordInputSignature:
        key = Psbt::CreatePubkeyRecordKey(
            Psbt::kPsbtInputPartialSig, pk_obj.GetPubkey());
        data = psbt_obj->psbt->GetTxInRecord(index, key);
        break;
      case kCfdPsbtRecordInputBip32:
        key = Psbt::CreatePubkeyRecordKey(
            Psbt::kPsbtInputBip32Derivation, pk_obj.GetPubkey());
        data = psbt_obj->psbt->GetTxInRecord(index, key);
        break;
      case kCfdPsbtRecordOutputBip32:
        key = Psbt::CreatePubkeyRecordKey(
            Psbt::kPsbtOutputBip32Derivation, pk_obj.GetPubkey());
        data = psbt_obj->psbt->GetTxOutRecord(index, key);
        break;
      case kCfdPsbtRecordGloalXpub:
        key = Psbt::CreateFixRecordKey(
            Psbt::kPsbtGlobalXpub, pk_obj.GetExtPubkey().GetData());
        data = psbt_obj->psbt->GetGlobalRecord(key);
        break;
      default:
        warn(CFD_LOG_SOURCE, "kind is invalid: {}", kind);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. kind is invalid.");
    }

    *value = CreateString(data.GetHex());
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}